

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

int SUNDlsMat_denseGEQRF(realtype **a,sunindextype m,sunindextype n,realtype *beta,realtype *v)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined8 *in_R8;
  sunindextype k;
  sunindextype j;
  sunindextype i;
  realtype *col_k;
  realtype *col_j;
  realtype v1_2;
  realtype v1;
  realtype mu;
  realtype s;
  realtype ajj;
  double local_78;
  double local_70;
  int local_64;
  int local_60;
  int local_5c;
  double local_30;
  
  for (local_60 = 0; local_60 < in_EDX; local_60 = local_60 + 1) {
    lVar2 = *(long *)(in_RDI + (long)local_60 * 8);
    local_78 = *(double *)(lVar2 + (long)local_60 * 8);
    *in_R8 = 0x3ff0000000000000;
    local_30 = 0.0;
    for (local_5c = 1; local_5c < in_ESI - local_60; local_5c = local_5c + 1) {
      in_R8[local_5c] = *(undefined8 *)(lVar2 + (long)(local_5c + local_60) * 8);
      local_30 = (double)in_R8[local_5c] * (double)in_R8[local_5c] + local_30;
    }
    if ((local_30 != 0.0) || (NAN(local_30))) {
      if (0.0 < local_78 * local_78 + local_30) {
        local_70 = sqrt(local_78 * local_78 + local_30);
      }
      else {
        local_70 = 0.0;
      }
      if (0.0 < local_78) {
        local_78 = -local_30 / (local_78 + local_70);
      }
      else {
        local_78 = local_78 - local_70;
      }
      *(double *)(in_RCX + (long)local_60 * 8) =
           (local_78 * local_78 * 2.0) / (local_30 + local_78 * local_78);
      for (local_5c = 1; local_5c < in_ESI - local_60; local_5c = local_5c + 1) {
        in_R8[local_5c] = (double)in_R8[local_5c] / local_78;
      }
    }
    else {
      *(undefined8 *)(in_RCX + (long)local_60 * 8) = 0;
    }
    for (local_64 = local_60; local_64 < in_EDX; local_64 = local_64 + 1) {
      lVar3 = *(long *)(in_RDI + (long)local_64 * 8);
      local_30 = 0.0;
      for (local_5c = 0; local_5c < in_ESI - local_60; local_5c = local_5c + 1) {
        local_30 = *(double *)(lVar3 + (long)(local_5c + local_60) * 8) * (double)in_R8[local_5c] +
                   local_30;
      }
      dVar1 = *(double *)(in_RCX + (long)local_60 * 8);
      for (local_5c = 0; local_5c < in_ESI - local_60; local_5c = local_5c + 1) {
        *(double *)(lVar3 + (long)(local_5c + local_60) * 8) =
             -(dVar1 * local_30) * (double)in_R8[local_5c] +
             *(double *)(lVar3 + (long)(local_5c + local_60) * 8);
      }
    }
    if (local_60 < in_ESI + -1) {
      for (local_5c = 1; local_5c < in_ESI - local_60; local_5c = local_5c + 1) {
        *(undefined8 *)(lVar2 + (long)(local_5c + local_60) * 8) = in_R8[local_5c];
      }
    }
  }
  return 0;
}

Assistant:

int SUNDlsMat_denseGEQRF(realtype **a, sunindextype m, sunindextype n, realtype *beta, realtype *v)
{
  realtype ajj, s, mu, v1, v1_2;
  realtype *col_j, *col_k;
  sunindextype i, j, k;

  /* For each column...*/
  for(j=0; j<n; j++) {

    col_j = a[j];

    ajj = col_j[j];

    /* Compute the j-th Householder vector (of length m-j) */
    v[0] = ONE;
    s = ZERO;
    for(i=1; i<m-j; i++) {
      v[i] = col_j[i+j];
      s += v[i]*v[i];
    }

    if(s != ZERO) {
      mu = SUNRsqrt(ajj*ajj+s);
      v1 = (ajj <= ZERO) ? ajj-mu : -s/(ajj+mu);
      v1_2 = v1*v1;
      beta[j] = TWO * v1_2 / (s + v1_2);
      for(i=1; i<m-j; i++) v[i] /= v1;
    } else {
      beta[j] = ZERO;
    }

    /* Update upper triangle of A (load R) */
    for(k=j; k<n; k++) {
      col_k = a[k];
      s = ZERO;
      for(i=0; i<m-j; i++) s += col_k[i+j]*v[i];
      s *= beta[j];
      for(i=0; i<m-j; i++) col_k[i+j] -= s*v[i];
    }

    /* Update A (load Householder vector) */
    if(j<m-1) {
      for(i=1; i<m-j; i++) col_j[i+j] = v[i];
    }

  }


  return(0);
}